

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O0

bool Gudhi::read_simplex<int,double>
               (istream *in_,vector<int,_std::allocator<int>_> *simplex,double *fil)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  int local_34;
  int local_30;
  int i;
  int v;
  int dim;
  double *fil_local;
  vector<int,_std::allocator<int>_> *simplex_local;
  istream *in__local;
  
  i = 0;
  _v = fil;
  fil_local = (double *)simplex;
  simplex_local = (vector<int,_std::allocator<int>_> *)in_;
  plVar2 = (long *)std::istream::operator>>(in_,&i);
  uVar3 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((uVar3 & 1) == 0) {
    for (local_34 = 0; local_34 < i + 1; local_34 = local_34 + 1) {
      plVar2 = (long *)std::istream::operator>>(simplex_local,&local_30);
      uVar3 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
      if ((uVar3 & 1) != 0) {
        return false;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)fil_local,&local_30);
    }
    plVar2 = (long *)std::istream::operator>>(simplex_local,_v);
    uVar3 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    pvVar1 = simplex_local;
    if ((uVar3 & 1) == 0) {
      lVar4 = std::numeric_limits<long>::max();
      std::istream::ignore((long)pvVar1,(int)lVar4);
      in__local._7_1_ = true;
    }
    else {
      in__local._7_1_ = false;
    }
  }
  else {
    in__local._7_1_ = false;
  }
  return in__local._7_1_;
}

Assistant:

bool read_simplex(std::istream& in_, std::vector<Vertex_handle>& simplex, Filtration_value& fil) {
  int dim = 0;
  if (!(in_ >> dim)) return false;
  Vertex_handle v;
  for (int i = 0; i < dim + 1; ++i) {
    if (!(in_ >> v)) return false;
    simplex.push_back(v);
  }
  if (!(in_ >> fil)) return false;
  in_.ignore((std::numeric_limits<std::streamsize>::max)(), '\n');  // ignore until the carriage return
  return true;
}